

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test::TestBody
          (CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test *this)

{
  int iVar1;
  int extraout_EAX;
  FileDescriptor *this_00;
  int *piVar2;
  Nonnull<const_char_*> pcVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *unaff_RBX;
  undefined1 *puVar4;
  RepeatedField<int> *this_01;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  char *message;
  pointer pcVar5;
  char *in_R9;
  RepeatedField<int> *unaff_R14;
  pointer *__ptr;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *unaff_R15;
  bool bVar6;
  string_view name;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  FileDescriptorProto file_desc_proto;
  AssertHelper local_150;
  Message local_148;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_140;
  undefined1 local_138 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  AssertHelper local_118;
  FileDescriptorProto local_110;
  
  name._M_str = "/test/test.proto";
  name._M_len = 0x10;
  this_00 = DescriptorPool::FindFileByName(&(this->super_CopySourceCodeInfoToTest).pool_,name);
  if (this_00 == (FileDescriptor *)0x0) {
    TestBody();
    iVar1 = extraout_EAX;
LAB_005cfb9e:
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)iVar1,"index < size()");
LAB_005cf59a:
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar3);
LAB_005cfcb2:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_138);
    }
    piVar2 = RepeatedField<int>::elements
                       (unaff_R14,
                        (undefined1  [16])
                        ((undefined1  [16])(unaff_R14->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    local_118.data_._0_4_ = *piVar2;
    testing::internal::CmpHelperEQ<google::protobuf::FileDescriptorProto::_unnamed_type_1_,int>
              ((internal *)&local_148,"FileDescriptorProto::kMessageTypeFieldNumber",
               "foo_location.path(0)",(anon_enum_32 *)&local_150,(int *)&local_118);
    if (local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if (local_140._M_head_impl == (LogMessageData *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (pointer)((local_140._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x394a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
      }
    }
    if (local_140._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_140._M_head_impl);
    }
    local_150.data_._0_4_ = 0;
    iVar1 = protobuf::internal::SooRep::size
                      (&unaff_R14->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(unaff_R14->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (iVar1 < 2) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)iVar1,"index < size()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar3);
      goto LAB_005cfcb2;
    }
    piVar2 = RepeatedField<int>::elements
                       (unaff_R14,
                        (undefined1  [16])
                        ((undefined1  [16])(unaff_R14->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    local_118.data_._0_4_ = piVar2[1];
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_148,"0","foo_location.path(1)",(int *)&local_150,(int *)&local_118
              );
    if (local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if (local_140._M_head_impl == (LogMessageData *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (pointer)((local_140._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x394b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
      }
    }
    if (local_140._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_140._M_head_impl);
    }
    local_148.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 3;
    this_01 = &(unaff_RBX->field_0)._impl_.span_;
    local_150.data_._0_4_ =
         protobuf::internal::SooRep::size
                   (&this_01->soo_rep_,(*(byte *)((long)&unaff_R15->field_0 + 0x20) & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_138,"3","foo_location.span_size()",(int *)&local_148,
               (int *)&local_150);
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message(&local_148);
      if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_130._M_head_impl == (LogMessageData *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = *(char **)local_130._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x394c,message);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      goto LAB_005cf927;
    }
    if (local_130._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_130._M_head_impl);
    }
    local_150.data_._0_4_ = 1;
    iVar1 = protobuf::internal::SooRep::size
                      (&this_01->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (iVar1 < 1) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)iVar1,"index < size()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar3);
      goto LAB_005cfcb2;
    }
    piVar2 = RepeatedField<int>::elements
                       (this_01,(undefined1  [16])
                                ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
    local_118.data_._0_4_ = *piVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_148,"1","foo_location.span(0)",(int *)&local_150,(int *)&local_118
              );
    if (local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if (local_140._M_head_impl == (LogMessageData *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (pointer)((local_140._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x394d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
      }
    }
    if (local_140._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_140._M_head_impl);
    }
    local_150.data_._0_4_ = 0;
    iVar1 = protobuf::internal::SooRep::size
                      (&this_01->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (iVar1 < 2) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)iVar1,"index < size()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar3);
      goto LAB_005cfcb2;
    }
    piVar2 = RepeatedField<int>::elements
                       (this_01,(undefined1  [16])
                                ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
    local_118.data_._0_4_ = piVar2[1];
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_148,"0","foo_location.span(1)",(int *)&local_150,(int *)&local_118
              );
    if (local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if (local_140._M_head_impl == (LogMessageData *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (pointer)((local_140._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x394e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
      }
    }
    if (local_140._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_140._M_head_impl);
    }
    local_150.data_._0_4_ = 0xe;
    iVar1 = protobuf::internal::SooRep::size
                      (&this_01->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (iVar1 < 3) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (2,(long)iVar1,"index < size()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar3);
      goto LAB_005cfcb2;
    }
    piVar2 = RepeatedField<int>::elements
                       (this_01,(undefined1  [16])
                                ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
    local_118.data_._0_4_ = piVar2[2];
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_148,"14","foo_location.span(2)",(int *)&local_150,
               (int *)&local_118);
    if (local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if (local_140._M_head_impl == (LogMessageData *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (pointer)((local_140._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x394f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
      }
    }
    if (local_140._M_head_impl == (LogMessageData *)0x0) goto LAB_005cf955;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_140;
    __ptr_00._M_head_impl = local_140._M_head_impl;
  }
  else {
    FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
    if ((((uint)local_110.field_0._impl_._has_bits_.has_bits_[0] & 0x10) != 0) &&
       (local_110.field_0._impl_.source_code_info_ == (SourceCodeInfo *)0x0)) {
      protobuf::internal::protobuf_assumption_failed
                ("!value || _impl_.source_code_info_ != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                 ,0x33e3);
    }
    bVar6 = ((uint)local_110.field_0._impl_._has_bits_.has_bits_[0] & 0x10) == 0;
    local_148.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_148.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar6);
    local_140._M_head_impl = (LogMessageData *)0x0;
    if (bVar6) {
      FileDescriptor::CopySourceCodeInfoTo(this_00,&local_110);
      puVar4 = (undefined1 *)local_110.field_0._impl_.source_code_info_;
      if (local_110.field_0._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
        puVar4 = _SourceCodeInfo_default_instance_;
      }
      local_148.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 4;
      local_150.data_._0_4_ = *(int *)((long)&((SourceCodeInfo *)puVar4)->field_0 + 0x20);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_138,"4","info.location_size()",(int *)&local_148,
                 (int *)&local_150);
      if (local_138[0] == (internal)0x0) {
        testing::Message::Message(&local_148);
        if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
            local_130._M_head_impl ==
            (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
            0x0) {
          pcVar5 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar5 = (pointer)((local_130._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x3946,pcVar5);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
      }
      else {
        if (local_130._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130._M_head_impl);
        }
        unaff_RBX = protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                              (&(((SourceCodeInfo *)puVar4)->field_0)._impl_.location_.
                                super_RepeatedPtrFieldBase,2);
        local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 2;
        unaff_R14 = &(unaff_RBX->field_0)._impl_.path_;
        local_150.data_._0_4_ =
             protobuf::internal::SooRep::size
                       (&unaff_R14->soo_rep_,
                        (undefined1  [96])
                        ((undefined1  [96])unaff_RBX->field_0 & (undefined1  [96])0x4) ==
                        (undefined1  [96])0x0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_138,"2","foo_location.path_size()",(int *)&local_148,
                   (int *)&local_150);
        if (local_138[0] != (internal)0x0) {
          if (local_130._M_head_impl != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130._M_head_impl);
          }
          local_150.data_._0_4_ = 4;
          iVar1 = protobuf::internal::SooRep::size
                            (&unaff_R14->soo_rep_,
                             (undefined1  [16])
                             ((undefined1  [16])(unaff_R14->soo_rep_).field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
          unaff_R15 = unaff_RBX;
          if (iVar1 < 1) goto LAB_005cfb9e;
          pcVar3 = (Nonnull<const_char_*>)0x0;
          goto LAB_005cf59a;
        }
        testing::Message::Message(&local_148);
        if (local_130._M_head_impl == (LogMessageData *)0x0) {
          pcVar5 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar5 = (pointer)((local_130._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x3949,pcVar5);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
      }
LAB_005cf927:
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)CONCAT44(local_148.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_148.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_148.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_148.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
      if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_130._M_head_impl ==
          (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
          0x0) goto LAB_005cf955;
      this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_130;
      __ptr_00._M_head_impl = local_130._M_head_impl;
    }
    else {
      this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_140;
      testing::Message::Message((Message *)&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_138,(internal *)&local_148,
                 (AssertionResult *)"file_desc_proto.has_source_code_info()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x3942,(char *)CONCAT71(local_138._1_7_,local_138[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_138._1_7_,local_138[0]) != &local_128) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_138._1_7_,local_138[0]),
                        local_128._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) + 8))();
      }
      __ptr_00._M_head_impl = local_140._M_head_impl;
      if (local_140._M_head_impl == (LogMessageData *)0x0) goto LAB_005cf955;
    }
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_head_impl);
LAB_005cf955:
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

TEST_F(CopySourceCodeInfoToTest, CopySourceCodeInfoTo) {
  const FileDescriptor* file_desc =
      ABSL_DIE_IF_NULL(pool_.FindFileByName("/test/test.proto"));
  FileDescriptorProto file_desc_proto;
  ASSERT_FALSE(file_desc_proto.has_source_code_info());

  file_desc->CopySourceCodeInfoTo(&file_desc_proto);
  const SourceCodeInfo& info = file_desc_proto.source_code_info();
  ASSERT_EQ(4, info.location_size());
  // Get the Foo message location
  const SourceCodeInfo_Location& foo_location = info.location(2);
  ASSERT_EQ(2, foo_location.path_size());
  EXPECT_EQ(FileDescriptorProto::kMessageTypeFieldNumber, foo_location.path(0));
  EXPECT_EQ(0, foo_location.path(1));      // Foo is the first message defined
  ASSERT_EQ(3, foo_location.span_size());  // Foo spans one line
  EXPECT_EQ(1, foo_location.span(0));      // Foo is declared on line 1
  EXPECT_EQ(0, foo_location.span(1));      // Foo starts at column 0
  EXPECT_EQ(14, foo_location.span(2));     // Foo ends on column 14
}